

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

void wabt::WriteDoubleHex(char *buffer,size_t size,uint64_t bits)

{
  uint64_t bits_local;
  size_t size_local;
  char *buffer_local;
  
  anon_unknown_0::FloatWriter<double>::WriteHex(buffer,size,bits);
  return;
}

Assistant:

void WriteDoubleHex(char* buffer, size_t size, uint64_t bits) {
  return FloatWriter<double>::WriteHex(buffer, size, bits);
}